

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void stbtt_GetScaledFontVMetrics
               (uchar *fontdata,int index,float size,float *ascent,float *descent,float *lineGap)

{
  ushort uVar1;
  int offset;
  long lVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  stbtt_fontinfo info;
  stbtt_fontinfo local_c0;
  
  offset = stbtt_GetFontOffsetForIndex(fontdata,index);
  stbtt_InitFont(&local_c0,fontdata,offset);
  if (size <= 0.0) {
    fVar5 = -size / (float)(ushort)(*(ushort *)(local_c0.data + (long)local_c0.head + 0x12) << 8 |
                                   *(ushort *)(local_c0.data + (long)local_c0.head + 0x12) >> 8);
    uVar3 = (uint)(ushort)(*(ushort *)(local_c0.data + (long)local_c0.hhea + 4) << 8 |
                          *(ushort *)(local_c0.data + (long)local_c0.hhea + 4) >> 8);
    uVar4 = (uint)(ushort)(*(ushort *)(local_c0.data + (long)local_c0.hhea + 6) << 8 |
                          *(ushort *)(local_c0.data + (long)local_c0.hhea + 6) >> 8);
  }
  else {
    lVar2 = (long)local_c0.hhea;
    uVar3 = (int)(short)((ushort)local_c0.data[lVar2 + 4] << 8) | (uint)local_c0.data[lVar2 + 5];
    uVar4 = (int)(short)((ushort)local_c0.data[lVar2 + 6] << 8) | (uint)local_c0.data[lVar2 + 7];
    fVar5 = size / (float)(int)(uVar3 - uVar4);
  }
  uVar1 = *(ushort *)(local_c0.data + (long)local_c0.hhea + 8);
  *ascent = (float)(int)(short)uVar3 * fVar5;
  *descent = (float)(int)(short)uVar4 * fVar5;
  *lineGap = (float)(int)(short)(uVar1 << 8 | uVar1 >> 8) * fVar5;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetScaledFontVMetrics(const unsigned char *fontdata, int index, float size, float *ascent, float *descent, float *lineGap)
{
int i_ascent, i_descent, i_lineGap;
float scale;
stbtt_fontinfo info;
stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata, index));
scale = size > 0 ? stbtt_ScaleForPixelHeight(&info, size) : stbtt_ScaleForMappingEmToPixels(&info, -size);
stbtt_GetFontVMetrics(&info, &i_ascent, &i_descent, &i_lineGap);
*ascent  = (float) i_ascent  * scale;
*descent = (float) i_descent * scale;
*lineGap = (float) i_lineGap * scale;
}